

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmerge.c
# Opt level: O2

void h2v2_merged_upsample
               (j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION in_row_group_ctr,
               JSAMPARRAY output_buf)

{
  uint uVar1;
  int iVar2;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var3;
  _func_void_j_decompress_ptr *p_Var4;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var5;
  jpeg_upsampler *pjVar6;
  JSAMPLE *pJVar7;
  JSAMPROW pJVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  JSAMPROW pJVar12;
  long lVar13;
  JSAMPROW pJVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  JSAMPROW pJVar20;
  JSAMPROW pJVar21;
  JSAMPROW pJVar22;
  _func_void_j_decompress_ptr *local_58;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *local_50;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *local_48;
  long local_40;
  
  switch(cinfo->out_color_space) {
  case JCS_EXT_RGB:
    pjVar6 = cinfo->upsample;
    pJVar7 = cinfo->sample_range_limit;
    local_48 = pjVar6[1].upsample;
    local_40 = *(long *)&pjVar6[1].need_context_rows;
    local_58 = pjVar6[2].start_pass;
    local_50 = pjVar6[2].upsample;
    pJVar22 = (*input_buf)[in_row_group_ctr * 2];
    pJVar14 = (*input_buf)[(ulong)(in_row_group_ctr * 2) + 1];
    pJVar20 = input_buf[1][in_row_group_ctr];
    pJVar21 = input_buf[2][in_row_group_ctr];
    pJVar12 = *output_buf;
    pJVar8 = output_buf[1];
    uVar1 = cinfo->output_width;
    lVar9 = 0;
    for (lVar10 = 0; uVar1 >> 1 != (uint)lVar10; lVar10 = lVar10 + 1) {
      lVar13 = (long)*(int *)(local_48 + (ulong)pJVar21[lVar10] * 4);
      lVar19 = *(long *)(local_58 + (ulong)pJVar21[lVar10] * 8);
      lVar18 = *(long *)(local_50 + (ulong)pJVar20[lVar10] * 8);
      lVar17 = (long)*(int *)(local_40 + (ulong)pJVar20[lVar10] * 4);
      uVar11 = (ulong)pJVar22[lVar10 * 2];
      pJVar12[lVar9] = pJVar7[lVar13 + uVar11];
      lVar19 = (long)(int)((ulong)(lVar19 + lVar18) >> 0x10);
      pJVar12[lVar9 + 1] = pJVar7[uVar11 + lVar19];
      pJVar12[lVar9 + 2] = pJVar7[uVar11 + lVar17];
      uVar11 = (ulong)pJVar22[lVar10 * 2 + 1];
      pJVar12[lVar9 + 3] = pJVar7[lVar13 + uVar11];
      pJVar12[lVar9 + 4] = pJVar7[uVar11 + lVar19];
      pJVar12[lVar9 + 5] = pJVar7[uVar11 + lVar17];
      uVar11 = (ulong)pJVar14[lVar10 * 2];
      pJVar8[lVar9] = pJVar7[lVar13 + uVar11];
      pJVar8[lVar9 + 1] = pJVar7[uVar11 + lVar19];
      pJVar8[lVar9 + 2] = pJVar7[uVar11 + lVar17];
      uVar11 = (ulong)pJVar14[lVar10 * 2 + 1];
      pJVar8[lVar9 + 3] = pJVar7[lVar13 + uVar11];
      pJVar8[lVar9 + 4] = pJVar7[lVar19 + uVar11];
      pJVar8[lVar9 + 5] = pJVar7[lVar17 + uVar11];
      lVar9 = lVar9 + 6;
    }
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    pjVar6 = cinfo->upsample;
    pJVar7 = cinfo->sample_range_limit;
    p_Var3 = pjVar6[1].upsample;
    lVar9 = *(long *)&pjVar6[1].need_context_rows;
    p_Var4 = pjVar6[2].start_pass;
    p_Var5 = pjVar6[2].upsample;
    pJVar22 = (*input_buf)[in_row_group_ctr * 2];
    pJVar14 = (*input_buf)[(ulong)(in_row_group_ctr * 2) + 1];
    pJVar20 = input_buf[1][in_row_group_ctr];
    pJVar21 = input_buf[2][in_row_group_ctr];
    pJVar12 = *output_buf;
    pJVar8 = output_buf[1];
    uVar1 = cinfo->output_width;
    for (lVar10 = 0; uVar1 >> 1 != (uint)lVar10; lVar10 = lVar10 + 1) {
      uVar11 = (ulong)pJVar20[lVar10];
      uVar15 = (ulong)pJVar21[lVar10];
      lVar13 = (long)*(int *)(p_Var3 + uVar15 * 4);
      lVar19 = *(long *)(p_Var4 + uVar15 * 8);
      lVar18 = *(long *)(p_Var5 + uVar11 * 8);
      lVar17 = (long)*(int *)(lVar9 + uVar11 * 4);
      uVar11 = (ulong)pJVar22[lVar10 * 2];
      pJVar12[lVar10 * 8] = pJVar7[lVar13 + uVar11];
      lVar19 = (long)(int)((ulong)(lVar19 + lVar18) >> 0x10);
      pJVar12[lVar10 * 8 + 1] = pJVar7[uVar11 + lVar19];
      pJVar12[lVar10 * 8 + 2] = pJVar7[uVar11 + lVar17];
      pJVar12[lVar10 * 8 + 3] = 0xff;
      uVar11 = (ulong)pJVar22[lVar10 * 2 + 1];
      pJVar12[lVar10 * 8 + 4] = pJVar7[lVar13 + uVar11];
      pJVar12[lVar10 * 8 + 5] = pJVar7[uVar11 + lVar19];
      pJVar12[lVar10 * 8 + 6] = pJVar7[uVar11 + lVar17];
      pJVar12[lVar10 * 8 + 7] = 0xff;
      uVar11 = (ulong)pJVar14[lVar10 * 2];
      pJVar8[lVar10 * 8] = pJVar7[lVar13 + uVar11];
      pJVar8[lVar10 * 8 + 1] = pJVar7[uVar11 + lVar19];
      pJVar8[lVar10 * 8 + 2] = pJVar7[uVar11 + lVar17];
      pJVar8[lVar10 * 8 + 3] = 0xff;
      uVar11 = (ulong)pJVar14[lVar10 * 2 + 1];
      pJVar8[lVar10 * 8 + 4] = pJVar7[lVar13 + uVar11];
      pJVar8[lVar10 * 8 + 5] = pJVar7[lVar19 + uVar11];
      pJVar8[lVar10 * 8 + 6] = pJVar7[lVar17 + uVar11];
      pJVar8[lVar10 * 8 + 7] = 0xff;
    }
    if ((cinfo->output_width & 1) == 0) {
      return;
    }
    uVar11 = (ulong)pJVar20[lVar10];
    uVar15 = (ulong)pJVar21[lVar10];
    lVar13 = (long)*(int *)(p_Var3 + uVar15 * 4);
    lVar19 = *(long *)(p_Var4 + uVar15 * 8);
    lVar18 = *(long *)(p_Var5 + uVar11 * 8);
    lVar9 = (long)*(int *)(lVar9 + uVar11 * 4);
    uVar11 = (ulong)pJVar22[lVar10 * 2];
    pJVar12[lVar10 * 8] = pJVar7[lVar13 + uVar11];
    lVar19 = (long)(int)((ulong)(lVar19 + lVar18) >> 0x10);
    pJVar12[lVar10 * 8 + 1] = pJVar7[uVar11 + lVar19];
    pJVar12[lVar10 * 8 + 2] = pJVar7[uVar11 + lVar9];
    pJVar12[lVar10 * 8 + 3] = 0xff;
    uVar11 = (ulong)pJVar14[lVar10 * 2];
    pJVar8[lVar10 * 8] = pJVar7[lVar13 + uVar11];
    pJVar8[lVar10 * 8 + 1] = pJVar7[lVar19 + uVar11];
    pJVar8[lVar10 * 8 + 2] = pJVar7[lVar9 + uVar11];
    goto LAB_0010e4dc;
  case JCS_EXT_BGR:
    pjVar6 = cinfo->upsample;
    pJVar7 = cinfo->sample_range_limit;
    p_Var3 = pjVar6[1].upsample;
    lVar9 = *(long *)&pjVar6[1].need_context_rows;
    p_Var4 = pjVar6[2].start_pass;
    p_Var5 = pjVar6[2].upsample;
    pJVar22 = (*input_buf)[in_row_group_ctr * 2];
    pJVar14 = (*input_buf)[(ulong)(in_row_group_ctr * 2) + 1];
    pJVar20 = input_buf[1][in_row_group_ctr];
    pJVar21 = input_buf[2][in_row_group_ctr];
    pJVar12 = *output_buf;
    pJVar8 = output_buf[1];
    uVar1 = cinfo->output_width;
    lVar10 = 0;
    for (lVar19 = 0; uVar1 >> 1 != (uint)lVar19; lVar19 = lVar19 + 1) {
      uVar11 = (ulong)pJVar20[lVar19];
      uVar15 = (ulong)pJVar21[lVar19];
      lVar17 = (long)*(int *)(p_Var3 + uVar15 * 4);
      lVar18 = *(long *)(p_Var4 + uVar15 * 8);
      lVar13 = *(long *)(p_Var5 + uVar11 * 8);
      lVar16 = (long)*(int *)(lVar9 + uVar11 * 4);
      uVar11 = (ulong)pJVar22[lVar19 * 2];
      pJVar12[lVar10 + 2] = pJVar7[lVar17 + uVar11];
      lVar18 = (long)(int)((ulong)(lVar18 + lVar13) >> 0x10);
      pJVar12[lVar10 + 1] = pJVar7[uVar11 + lVar18];
      pJVar12[lVar10] = pJVar7[uVar11 + lVar16];
      uVar11 = (ulong)pJVar22[lVar19 * 2 + 1];
      pJVar12[lVar10 + 5] = pJVar7[lVar17 + uVar11];
      pJVar12[lVar10 + 4] = pJVar7[uVar11 + lVar18];
      pJVar12[lVar10 + 3] = pJVar7[uVar11 + lVar16];
      uVar11 = (ulong)pJVar14[lVar19 * 2];
      pJVar8[lVar10 + 2] = pJVar7[lVar17 + uVar11];
      pJVar8[lVar10 + 1] = pJVar7[uVar11 + lVar18];
      pJVar8[lVar10] = pJVar7[uVar11 + lVar16];
      uVar11 = (ulong)pJVar14[lVar19 * 2 + 1];
      pJVar8[lVar10 + 5] = pJVar7[lVar17 + uVar11];
      pJVar8[lVar10 + 4] = pJVar7[lVar18 + uVar11];
      pJVar8[lVar10 + 3] = pJVar7[lVar16 + uVar11];
      lVar10 = lVar10 + 6;
    }
    if ((cinfo->output_width & 1) == 0) {
      return;
    }
    uVar11 = (ulong)pJVar20[lVar19];
    uVar15 = (ulong)pJVar21[lVar19];
    lVar18 = *(long *)(p_Var4 + uVar15 * 8);
    lVar13 = *(long *)(p_Var5 + uVar11 * 8);
    lVar17 = (long)*(int *)(p_Var3 + uVar15 * 4);
    lVar9 = (long)*(int *)(lVar9 + uVar11 * 4);
    uVar11 = (ulong)pJVar22[lVar19 * 2];
    pJVar12[lVar10 + 2] = pJVar7[lVar17 + uVar11];
    lVar18 = (long)(int)((ulong)(lVar18 + lVar13) >> 0x10);
    pJVar12[lVar10 + 1] = pJVar7[uVar11 + lVar18];
    pJVar12[lVar10] = pJVar7[uVar11 + lVar9];
    uVar11 = (ulong)pJVar14[lVar19 * 2];
    pJVar8[lVar10 + 2] = pJVar7[lVar17 + uVar11];
    pJVar8[lVar10 + 1] = pJVar7[lVar18 + uVar11];
    pJVar8[lVar10] = pJVar7[lVar9 + uVar11];
    return;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    pjVar6 = cinfo->upsample;
    pJVar7 = cinfo->sample_range_limit;
    p_Var3 = pjVar6[1].upsample;
    lVar9 = *(long *)&pjVar6[1].need_context_rows;
    p_Var4 = pjVar6[2].start_pass;
    p_Var5 = pjVar6[2].upsample;
    pJVar22 = (*input_buf)[in_row_group_ctr * 2];
    pJVar14 = (*input_buf)[(ulong)(in_row_group_ctr * 2) + 1];
    pJVar20 = input_buf[1][in_row_group_ctr];
    pJVar21 = input_buf[2][in_row_group_ctr];
    pJVar12 = *output_buf;
    pJVar8 = output_buf[1];
    uVar1 = cinfo->output_width;
    for (lVar10 = 0; uVar1 >> 1 != (uint)lVar10; lVar10 = lVar10 + 1) {
      uVar11 = (ulong)pJVar20[lVar10];
      uVar15 = (ulong)pJVar21[lVar10];
      lVar13 = (long)*(int *)(p_Var3 + uVar15 * 4);
      lVar19 = *(long *)(p_Var4 + uVar15 * 8);
      lVar18 = *(long *)(p_Var5 + uVar11 * 8);
      lVar17 = (long)*(int *)(lVar9 + uVar11 * 4);
      uVar11 = (ulong)pJVar22[lVar10 * 2];
      pJVar12[lVar10 * 8 + 2] = pJVar7[lVar13 + uVar11];
      lVar19 = (long)(int)((ulong)(lVar19 + lVar18) >> 0x10);
      pJVar12[lVar10 * 8 + 1] = pJVar7[uVar11 + lVar19];
      pJVar12[lVar10 * 8] = pJVar7[uVar11 + lVar17];
      pJVar12[lVar10 * 8 + 3] = 0xff;
      uVar11 = (ulong)pJVar22[lVar10 * 2 + 1];
      pJVar12[lVar10 * 8 + 6] = pJVar7[lVar13 + uVar11];
      pJVar12[lVar10 * 8 + 5] = pJVar7[uVar11 + lVar19];
      pJVar12[lVar10 * 8 + 4] = pJVar7[uVar11 + lVar17];
      pJVar12[lVar10 * 8 + 7] = 0xff;
      uVar11 = (ulong)pJVar14[lVar10 * 2];
      pJVar8[lVar10 * 8 + 2] = pJVar7[lVar13 + uVar11];
      pJVar8[lVar10 * 8 + 1] = pJVar7[uVar11 + lVar19];
      pJVar8[lVar10 * 8] = pJVar7[uVar11 + lVar17];
      pJVar8[lVar10 * 8 + 3] = 0xff;
      uVar11 = (ulong)pJVar14[lVar10 * 2 + 1];
      pJVar8[lVar10 * 8 + 6] = pJVar7[lVar13 + uVar11];
      pJVar8[lVar10 * 8 + 5] = pJVar7[lVar19 + uVar11];
      pJVar8[lVar10 * 8 + 4] = pJVar7[lVar17 + uVar11];
      pJVar8[lVar10 * 8 + 7] = 0xff;
    }
    if ((cinfo->output_width & 1) == 0) {
      return;
    }
    uVar11 = (ulong)pJVar20[lVar10];
    uVar15 = (ulong)pJVar21[lVar10];
    lVar13 = (long)*(int *)(p_Var3 + uVar15 * 4);
    lVar19 = *(long *)(p_Var4 + uVar15 * 8);
    lVar18 = *(long *)(p_Var5 + uVar11 * 8);
    lVar9 = (long)*(int *)(lVar9 + uVar11 * 4);
    uVar11 = (ulong)pJVar22[lVar10 * 2];
    pJVar12[lVar10 * 8 + 2] = pJVar7[lVar13 + uVar11];
    lVar19 = (long)(int)((ulong)(lVar19 + lVar18) >> 0x10);
    pJVar12[lVar10 * 8 + 1] = pJVar7[uVar11 + lVar19];
    pJVar12[lVar10 * 8] = pJVar7[uVar11 + lVar9];
    pJVar12[lVar10 * 8 + 3] = 0xff;
    uVar11 = (ulong)pJVar14[lVar10 * 2];
    pJVar8[lVar10 * 8 + 2] = pJVar7[lVar13 + uVar11];
    pJVar8[lVar10 * 8 + 1] = pJVar7[lVar19 + uVar11];
    pJVar8[lVar10 * 8] = pJVar7[lVar9 + uVar11];
LAB_0010e4dc:
    pJVar8[lVar10 * 8 + 3] = 0xff;
    return;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    pjVar6 = cinfo->upsample;
    pJVar7 = cinfo->sample_range_limit;
    p_Var3 = pjVar6[1].upsample;
    lVar9 = *(long *)&pjVar6[1].need_context_rows;
    p_Var4 = pjVar6[2].start_pass;
    p_Var5 = pjVar6[2].upsample;
    pJVar22 = (*input_buf)[in_row_group_ctr * 2];
    pJVar14 = (*input_buf)[(ulong)(in_row_group_ctr * 2) + 1];
    pJVar20 = input_buf[1][in_row_group_ctr];
    pJVar21 = input_buf[2][in_row_group_ctr];
    pJVar12 = *output_buf;
    pJVar8 = output_buf[1];
    uVar1 = cinfo->output_width;
    for (lVar10 = 0; uVar1 >> 1 != (uint)lVar10; lVar10 = lVar10 + 1) {
      uVar11 = (ulong)pJVar20[lVar10];
      uVar15 = (ulong)pJVar21[lVar10];
      lVar13 = (long)*(int *)(p_Var3 + uVar15 * 4);
      lVar19 = *(long *)(p_Var4 + uVar15 * 8);
      lVar18 = *(long *)(p_Var5 + uVar11 * 8);
      lVar17 = (long)*(int *)(lVar9 + uVar11 * 4);
      uVar11 = (ulong)pJVar22[lVar10 * 2];
      pJVar12[lVar10 * 8 + 3] = pJVar7[lVar13 + uVar11];
      lVar19 = (long)(int)((ulong)(lVar19 + lVar18) >> 0x10);
      pJVar12[lVar10 * 8 + 2] = pJVar7[uVar11 + lVar19];
      pJVar12[lVar10 * 8 + 1] = pJVar7[uVar11 + lVar17];
      pJVar12[lVar10 * 8] = 0xff;
      uVar11 = (ulong)pJVar22[lVar10 * 2 + 1];
      pJVar12[lVar10 * 8 + 7] = pJVar7[lVar13 + uVar11];
      pJVar12[lVar10 * 8 + 6] = pJVar7[uVar11 + lVar19];
      pJVar12[lVar10 * 8 + 5] = pJVar7[uVar11 + lVar17];
      pJVar12[lVar10 * 8 + 4] = 0xff;
      uVar11 = (ulong)pJVar14[lVar10 * 2];
      pJVar8[lVar10 * 8 + 3] = pJVar7[lVar13 + uVar11];
      pJVar8[lVar10 * 8 + 2] = pJVar7[uVar11 + lVar19];
      pJVar8[lVar10 * 8 + 1] = pJVar7[uVar11 + lVar17];
      pJVar8[lVar10 * 8] = 0xff;
      uVar11 = (ulong)pJVar14[lVar10 * 2 + 1];
      pJVar8[lVar10 * 8 + 7] = pJVar7[lVar13 + uVar11];
      pJVar8[lVar10 * 8 + 6] = pJVar7[lVar19 + uVar11];
      pJVar8[lVar10 * 8 + 5] = pJVar7[lVar17 + uVar11];
      pJVar8[lVar10 * 8 + 4] = 0xff;
    }
    if ((cinfo->output_width & 1) == 0) {
      return;
    }
    uVar11 = (ulong)pJVar20[lVar10];
    uVar15 = (ulong)pJVar21[lVar10];
    lVar13 = (long)*(int *)(p_Var3 + uVar15 * 4);
    lVar19 = *(long *)(p_Var4 + uVar15 * 8);
    lVar18 = *(long *)(p_Var5 + uVar11 * 8);
    lVar9 = (long)*(int *)(lVar9 + uVar11 * 4);
    uVar11 = (ulong)pJVar22[lVar10 * 2];
    pJVar12[lVar10 * 8 + 3] = pJVar7[lVar13 + uVar11];
    lVar19 = (long)(int)((ulong)(lVar19 + lVar18) >> 0x10);
    pJVar12[lVar10 * 8 + 2] = pJVar7[uVar11 + lVar19];
    pJVar12[lVar10 * 8 + 1] = pJVar7[uVar11 + lVar9];
    pJVar12[lVar10 * 8] = 0xff;
    uVar11 = (ulong)pJVar14[lVar10 * 2];
    pJVar8[lVar10 * 8 + 3] = pJVar7[lVar13 + uVar11];
    pJVar8[lVar10 * 8 + 2] = pJVar7[lVar19 + uVar11];
    pJVar8[lVar10 * 8 + 1] = pJVar7[lVar9 + uVar11];
    goto LAB_0010e438;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    pjVar6 = cinfo->upsample;
    pJVar7 = cinfo->sample_range_limit;
    p_Var3 = pjVar6[1].upsample;
    lVar9 = *(long *)&pjVar6[1].need_context_rows;
    p_Var4 = pjVar6[2].start_pass;
    p_Var5 = pjVar6[2].upsample;
    pJVar22 = (*input_buf)[in_row_group_ctr * 2];
    pJVar14 = (*input_buf)[(ulong)(in_row_group_ctr * 2) + 1];
    pJVar20 = input_buf[1][in_row_group_ctr];
    pJVar21 = input_buf[2][in_row_group_ctr];
    pJVar12 = *output_buf;
    pJVar8 = output_buf[1];
    uVar1 = cinfo->output_width;
    for (lVar10 = 0; uVar1 >> 1 != (uint)lVar10; lVar10 = lVar10 + 1) {
      uVar11 = (ulong)pJVar20[lVar10];
      uVar15 = (ulong)pJVar21[lVar10];
      lVar17 = (long)*(int *)(p_Var3 + uVar15 * 4);
      lVar19 = *(long *)(p_Var4 + uVar15 * 8);
      lVar18 = *(long *)(p_Var5 + uVar11 * 8);
      lVar13 = (long)*(int *)(lVar9 + uVar11 * 4);
      uVar11 = (ulong)pJVar22[lVar10 * 2];
      pJVar12[lVar10 * 8 + 1] = pJVar7[lVar17 + uVar11];
      lVar19 = (long)(int)((ulong)(lVar19 + lVar18) >> 0x10);
      pJVar12[lVar10 * 8 + 2] = pJVar7[uVar11 + lVar19];
      pJVar12[lVar10 * 8 + 3] = pJVar7[uVar11 + lVar13];
      pJVar12[lVar10 * 8] = 0xff;
      uVar11 = (ulong)pJVar22[lVar10 * 2 + 1];
      pJVar12[lVar10 * 8 + 5] = pJVar7[lVar17 + uVar11];
      pJVar12[lVar10 * 8 + 6] = pJVar7[uVar11 + lVar19];
      pJVar12[lVar10 * 8 + 7] = pJVar7[uVar11 + lVar13];
      pJVar12[lVar10 * 8 + 4] = 0xff;
      uVar11 = (ulong)pJVar14[lVar10 * 2];
      pJVar8[lVar10 * 8 + 1] = pJVar7[lVar17 + uVar11];
      pJVar8[lVar10 * 8 + 2] = pJVar7[uVar11 + lVar19];
      pJVar8[lVar10 * 8 + 3] = pJVar7[uVar11 + lVar13];
      pJVar8[lVar10 * 8] = 0xff;
      uVar11 = (ulong)pJVar14[lVar10 * 2 + 1];
      pJVar8[lVar10 * 8 + 5] = pJVar7[lVar17 + uVar11];
      pJVar8[lVar10 * 8 + 6] = pJVar7[lVar19 + uVar11];
      pJVar8[lVar10 * 8 + 7] = pJVar7[lVar13 + uVar11];
      pJVar8[lVar10 * 8 + 4] = 0xff;
    }
    if ((cinfo->output_width & 1) == 0) {
      return;
    }
    uVar11 = (ulong)pJVar20[lVar10];
    uVar15 = (ulong)pJVar21[lVar10];
    lVar13 = (long)*(int *)(p_Var3 + uVar15 * 4);
    lVar19 = *(long *)(p_Var4 + uVar15 * 8);
    lVar18 = *(long *)(p_Var5 + uVar11 * 8);
    lVar9 = (long)*(int *)(lVar9 + uVar11 * 4);
    uVar11 = (ulong)pJVar22[lVar10 * 2];
    pJVar12[lVar10 * 8 + 1] = pJVar7[lVar13 + uVar11];
    lVar19 = (long)(int)((ulong)(lVar19 + lVar18) >> 0x10);
    pJVar12[lVar10 * 8 + 2] = pJVar7[uVar11 + lVar19];
    pJVar12[lVar10 * 8 + 3] = pJVar7[uVar11 + lVar9];
    pJVar12[lVar10 * 8] = 0xff;
    uVar11 = (ulong)pJVar14[lVar10 * 2];
    pJVar8[lVar10 * 8 + 1] = pJVar7[lVar13 + uVar11];
    pJVar8[lVar10 * 8 + 2] = pJVar7[lVar19 + uVar11];
    pJVar8[lVar10 * 8 + 3] = pJVar7[lVar9 + uVar11];
LAB_0010e438:
    pJVar8[lVar10 * 8] = 0xff;
    return;
  default:
    pjVar6 = cinfo->upsample;
    pJVar7 = cinfo->sample_range_limit;
    local_48 = pjVar6[1].upsample;
    local_40 = *(long *)&pjVar6[1].need_context_rows;
    local_58 = pjVar6[2].start_pass;
    local_50 = pjVar6[2].upsample;
    pJVar22 = (*input_buf)[in_row_group_ctr * 2];
    pJVar14 = (*input_buf)[(ulong)(in_row_group_ctr * 2) + 1];
    pJVar20 = input_buf[1][in_row_group_ctr];
    pJVar21 = input_buf[2][in_row_group_ctr];
    pJVar12 = *output_buf;
    pJVar8 = output_buf[1];
    uVar1 = cinfo->output_width;
    lVar9 = 0;
    for (lVar10 = 0; uVar1 >> 1 != (uint)lVar10; lVar10 = lVar10 + 1) {
      lVar13 = (long)*(int *)(local_48 + (ulong)pJVar21[lVar10] * 4);
      lVar19 = *(long *)(local_58 + (ulong)pJVar21[lVar10] * 8);
      lVar18 = *(long *)(local_50 + (ulong)pJVar20[lVar10] * 8);
      lVar17 = (long)*(int *)(local_40 + (ulong)pJVar20[lVar10] * 4);
      uVar11 = (ulong)pJVar22[lVar10 * 2];
      pJVar12[lVar9] = pJVar7[lVar13 + uVar11];
      lVar19 = (long)(int)((ulong)(lVar19 + lVar18) >> 0x10);
      pJVar12[lVar9 + 1] = pJVar7[uVar11 + lVar19];
      pJVar12[lVar9 + 2] = pJVar7[uVar11 + lVar17];
      uVar11 = (ulong)pJVar22[lVar10 * 2 + 1];
      pJVar12[lVar9 + 3] = pJVar7[lVar13 + uVar11];
      pJVar12[lVar9 + 4] = pJVar7[uVar11 + lVar19];
      pJVar12[lVar9 + 5] = pJVar7[uVar11 + lVar17];
      uVar11 = (ulong)pJVar14[lVar10 * 2];
      pJVar8[lVar9] = pJVar7[lVar13 + uVar11];
      pJVar8[lVar9 + 1] = pJVar7[uVar11 + lVar19];
      pJVar8[lVar9 + 2] = pJVar7[uVar11 + lVar17];
      uVar11 = (ulong)pJVar14[lVar10 * 2 + 1];
      pJVar8[lVar9 + 3] = pJVar7[lVar13 + uVar11];
      pJVar8[lVar9 + 4] = pJVar7[lVar19 + uVar11];
      pJVar8[lVar9 + 5] = pJVar7[lVar17 + uVar11];
      lVar9 = lVar9 + 6;
    }
  }
  if ((cinfo->output_width & 1) != 0) {
    lVar19 = *(long *)(local_58 + (ulong)pJVar21[lVar10] * 8);
    lVar18 = *(long *)(local_50 + (ulong)pJVar20[lVar10] * 8);
    iVar2 = *(int *)(local_48 + (ulong)pJVar21[lVar10] * 4);
    lVar13 = (long)*(int *)(local_40 + (ulong)pJVar20[lVar10] * 4);
    uVar11 = (ulong)pJVar22[lVar10 * 2];
    pJVar12[lVar9] = pJVar7[(long)iVar2 + uVar11];
    lVar19 = (long)(int)((ulong)(lVar19 + lVar18) >> 0x10);
    pJVar12[lVar9 + 1] = pJVar7[uVar11 + lVar19];
    pJVar12[lVar9 + 2] = pJVar7[uVar11 + lVar13];
    uVar11 = (ulong)pJVar14[lVar10 * 2];
    pJVar8[lVar9] = pJVar7[(long)iVar2 + uVar11];
    pJVar8[lVar9 + 1] = pJVar7[lVar19 + uVar11];
    pJVar8[lVar9 + 2] = pJVar7[lVar13 + uVar11];
  }
  return;
}

Assistant:

METHODDEF(void)
h2v2_merged_upsample(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                     JDIMENSION in_row_group_ctr, JSAMPARRAY output_buf)
{
  switch (cinfo->out_color_space) {
  case JCS_EXT_RGB:
    extrgb_h2v2_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                         output_buf);
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    extrgbx_h2v2_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                          output_buf);
    break;
  case JCS_EXT_BGR:
    extbgr_h2v2_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                         output_buf);
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    extbgrx_h2v2_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                          output_buf);
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    extxbgr_h2v2_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                          output_buf);
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    extxrgb_h2v2_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                          output_buf);
    break;
  default:
    h2v2_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                  output_buf);
    break;
  }
}